

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O1

int __thiscall ThreadTask::init(ThreadTask *this,EVP_PKEY_CTX *ctx)

{
  thread local_18;
  anon_class_8_1_8991fb9c_for__M_head_impl local_10;
  
  local_10.this = this;
  std::thread::thread<ThreadTask::init()::_lambda()_1_,,void>(&local_18,&local_10);
  if ((this->_thread)._M_id._M_thread == 0) {
    (this->_thread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return (int)local_18._M_id._M_thread;
  }
  std::terminate();
}

Assistant:

void init()
	{
		_thread = std::thread(
			[this]()
		{
			while (true)
			{
				std::unique_lock<std::mutex> lock(this->_queueMutex);
				this->_condition.wait(lock,
					[this] { return !this->_taskQueue.empty(); });
				auto task = this->_taskQueue.front();
				this->_taskQueue.pop();
				task.task();
				if (task.callback != nullptr)
					task.callback();
			}
		}
		);
	}